

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacklib.c
# Opt level: O2

int rounddiv(long x,int y)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  
  if (y != 0) {
    uVar4 = -y;
    if (0 < y) {
      uVar4 = y;
    }
    uVar5 = y >> 0x1f | 1;
    uVar3 = -x;
    if (0 < x) {
      uVar3 = x;
    }
    uVar2 = -uVar5;
    if (-1 < x) {
      uVar2 = uVar5;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar3;
    return ((SUB164(auVar1 / ZEXT416(uVar4),0) + 1) -
           (uint)((uint)(SUB164(auVar1 % ZEXT416(uVar4),0) * 2) < uVar4)) * uVar2;
  }
  panic("division by zero in rounddiv");
}

Assistant:

int rounddiv(long x, int y)	/* calculate x/y, rounding as appropriate */
{
    int r, m;
    int divsgn = 1;

    if (y == 0)
	panic("division by zero in rounddiv");
    else if (y < 0) {
	divsgn = -divsgn;  y = -y;
    }
    if (x < 0) {
	divsgn = -divsgn;  x = -x;
    }
    r = x / y;
    m = x % y;
    if (2*m >= y) r++;

    return divsgn * r;
}